

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

bool __thiscall
cfd::TransactionController::VerifyInputSignature
          (TransactionController *this,ByteData *signature,Pubkey *pubkey,Txid *txid,uint32_t vout,
          Script *script,SigHashType *param_7,Amount *param_8,WitnessVersion param_9)

{
  undefined1 uVar1;
  void *local_88 [3];
  ByteData256 local_70;
  ByteData sighash;
  SigHashType local_3c [12];
  
  cfd::core::SigHashType::SigHashType(local_3c,param_7);
  CreateSignatureHash(&sighash,this,txid,vout,script,local_3c,param_8,param_9);
  cfd::core::ByteData::GetBytes();
  cfd::core::ByteData256::ByteData256(&local_70,(vector *)local_88);
  uVar1 = cfd::core::SignatureUtil::VerifyEcSignature(&local_70,pubkey,signature);
  if (local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88[0] != (void *)0x0) {
    operator_delete(local_88[0]);
  }
  if (sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)uVar1;
}

Assistant:

bool TransactionController::VerifyInputSignature(
    const ByteData& signature, const Pubkey& pubkey, const Txid& txid,
    uint32_t vout, const Script& script, SigHashType sighash_type,
    const Amount& value, WitnessVersion version) const {
  auto sighash = this->CreateSignatureHash(
      txid, vout, script, sighash_type, value, version);
  return SignatureUtil::VerifyEcSignature(
      ByteData256(sighash.GetBytes()), pubkey, signature);
}